

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strduptrim.c
# Opt level: O0

char * host_strduptrim(char *s)

{
  ushort **ppuVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  int local_24;
  byte *pbStack_20;
  int colons;
  char *p;
  char *s_local;
  
  if (*s == '[') {
    pbStack_20 = (byte *)(s + 1);
    local_24 = 0;
    while( true ) {
      bVar4 = false;
      if (*pbStack_20 != 0) {
        bVar4 = *pbStack_20 != 0x5d;
      }
      if (!bVar4) break;
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)(uint)*pbStack_20] & 0x1000) == 0) {
        if (*pbStack_20 != 0x3a) break;
        local_24 = local_24 + 1;
      }
      pbStack_20 = pbStack_20 + 1;
    }
    if (*pbStack_20 == 0x25) {
      sVar2 = strcspn((char *)pbStack_20,"]");
      pbStack_20 = pbStack_20 + sVar2;
    }
    if (((*pbStack_20 == 0x5d) && (pbStack_20[1] == 0)) && (1 < local_24)) {
      pcVar3 = dupprintf("%.*s",(ulong)(uint)((int)pbStack_20 - ((int)s + 1)),s + 1);
      return pcVar3;
    }
  }
  pcVar3 = dupstr(s);
  return pcVar3;
}

Assistant:

char *host_strduptrim(const char *s)
{
    if (s[0] == '[') {
        const char *p = s+1;
        int colons = 0;
        while (*p && *p != ']') {
            if (isxdigit((unsigned char)*p))
                /* OK */;
            else if (*p == ':')
                colons++;
            else
                break;
            p++;
        }
        if (*p == '%') {
            /*
             * This delimiter character introduces an RFC 4007 scope
             * id suffix (e.g. suffixing the address literal with
             * %eth1 or %2 or some such). There's no syntax
             * specification for the scope id, so just accept anything
             * except the closing ].
             */
            p += strcspn(p, "]");
        }
        if (*p == ']' && !p[1] && colons > 1) {
            /*
             * This looks like an IPv6 address literal (hex digits and
             * at least two colons, plus optional scope id, contained
             * in square brackets). Trim off the brackets.
             */
            return dupprintf("%.*s", (int)(p - (s+1)), s+1);
        }
    }

    /*
     * Any other shape of string is simply duplicated.
     */
    return dupstr(s);
}